

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O0

void blend_a64_d16_mask_w16_sse41
               (uint8_t *dst,CONV_BUF_TYPE *src0,CONV_BUF_TYPE *src1,__m128i *m0,__m128i *m1,
               __m128i *v_round_offset,__m128i *v_maxval,int shift)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 *in_RCX;
  void *in_RDX;
  void *in_RSI;
  undefined8 *in_RDI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  __m128i res;
  __m128i res1;
  __m128i res0;
  __m128i res1_hi;
  __m128i res1_lo;
  __m128i res0_hi;
  __m128i res0_lo;
  __m128i s1_1;
  __m128i s1_0;
  __m128i s0_1;
  __m128i s0_0;
  __m128i max_minus_m1;
  __m128i max_minus_m0;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  short local_348;
  short sStack_346;
  short sStack_344;
  short sStack_342;
  short sStack_340;
  short sStack_33e;
  short sStack_33c;
  short sStack_33a;
  short local_338;
  short sStack_336;
  short sStack_334;
  short sStack_332;
  short sStack_330;
  short sStack_32e;
  short sStack_32c;
  short sStack_32a;
  short local_308;
  short sStack_306;
  short sStack_304;
  short sStack_302;
  short sStack_300;
  short sStack_2fe;
  short sStack_2fc;
  short sStack_2fa;
  short local_2f8;
  short sStack_2f6;
  short sStack_2f4;
  short sStack_2f2;
  short sStack_2f0;
  short sStack_2ee;
  short sStack_2ec;
  short sStack_2ea;
  short local_2e8;
  short sStack_2e6;
  short sStack_2e4;
  short sStack_2e2;
  short sStack_2e0;
  short sStack_2de;
  short sStack_2dc;
  short sStack_2da;
  short local_2d8;
  short sStack_2d6;
  short sStack_2d4;
  short sStack_2d2;
  short sStack_2d0;
  short sStack_2ce;
  short sStack_2cc;
  short sStack_2ca;
  undefined2 local_2b8;
  undefined2 uStack_2b6;
  undefined2 uStack_2b4;
  undefined2 uStack_2b2;
  undefined2 local_2a8;
  undefined2 uStack_2a6;
  undefined2 uStack_2a4;
  undefined2 uStack_2a2;
  undefined2 local_298;
  undefined2 uStack_296;
  undefined2 uStack_294;
  undefined2 uStack_292;
  undefined2 local_278;
  undefined2 uStack_276;
  undefined2 uStack_274;
  undefined2 uStack_272;
  undefined2 local_268;
  undefined2 uStack_266;
  undefined2 uStack_264;
  undefined2 uStack_262;
  undefined2 local_258;
  undefined2 uStack_256;
  undefined2 uStack_254;
  undefined2 uStack_252;
  undefined2 uStack_230;
  undefined2 uStack_22e;
  undefined2 uStack_22c;
  undefined2 uStack_22a;
  undefined2 uStack_220;
  undefined2 uStack_21e;
  undefined2 uStack_21c;
  undefined2 uStack_21a;
  undefined2 uStack_210;
  undefined2 uStack_20e;
  undefined2 uStack_20c;
  undefined2 uStack_20a;
  undefined2 uStack_1f0;
  undefined2 uStack_1ee;
  undefined2 uStack_1ec;
  undefined2 uStack_1ea;
  undefined2 uStack_1e0;
  undefined2 uStack_1de;
  undefined2 uStack_1dc;
  undefined2 uStack_1da;
  undefined2 uStack_1d0;
  undefined2 uStack_1ce;
  undefined2 uStack_1cc;
  undefined2 uStack_1ca;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  
  uVar1 = *(undefined8 *)res[1];
  uVar2 = *(undefined8 *)(res[1] + 8);
  uVar3 = *in_RCX;
  uVar4 = in_RCX[1];
  local_2d8 = (short)uVar1;
  sStack_2d6 = (short)((ulong)uVar1 >> 0x10);
  sStack_2d4 = (short)((ulong)uVar1 >> 0x20);
  sStack_2d2 = (short)((ulong)uVar1 >> 0x30);
  sStack_2d0 = (short)uVar2;
  sStack_2ce = (short)((ulong)uVar2 >> 0x10);
  sStack_2cc = (short)((ulong)uVar2 >> 0x20);
  sStack_2ca = (short)((ulong)uVar2 >> 0x30);
  local_2e8 = (short)uVar3;
  sStack_2e6 = (short)((ulong)uVar3 >> 0x10);
  sStack_2e4 = (short)((ulong)uVar3 >> 0x20);
  sStack_2e2 = (short)((ulong)uVar3 >> 0x30);
  sStack_2e0 = (short)uVar4;
  sStack_2de = (short)((ulong)uVar4 >> 0x10);
  sStack_2dc = (short)((ulong)uVar4 >> 0x20);
  sStack_2da = (short)((ulong)uVar4 >> 0x30);
  uVar1 = *(undefined8 *)res[1];
  uVar2 = *(undefined8 *)(res[1] + 8);
  uVar3 = *in_R8;
  uVar4 = in_R8[1];
  local_2f8 = (short)uVar1;
  sStack_2f6 = (short)((ulong)uVar1 >> 0x10);
  sStack_2f4 = (short)((ulong)uVar1 >> 0x20);
  sStack_2f2 = (short)((ulong)uVar1 >> 0x30);
  sStack_2f0 = (short)uVar2;
  sStack_2ee = (short)((ulong)uVar2 >> 0x10);
  sStack_2ec = (short)((ulong)uVar2 >> 0x20);
  sStack_2ea = (short)((ulong)uVar2 >> 0x30);
  local_308 = (short)uVar3;
  sStack_306 = (short)((ulong)uVar3 >> 0x10);
  sStack_304 = (short)((ulong)uVar3 >> 0x20);
  sStack_302 = (short)((ulong)uVar3 >> 0x30);
  sStack_300 = (short)uVar4;
  sStack_2fe = (short)((ulong)uVar4 >> 0x10);
  sStack_2fc = (short)((ulong)uVar4 >> 0x20);
  sStack_2fa = (short)((ulong)uVar4 >> 0x30);
  xx_loadu_128(in_RSI);
  xx_loadu_128((void *)((long)in_RSI + 0x10));
  xx_loadu_128(in_RDX);
  xx_loadu_128((void *)((long)in_RDX + 0x10));
  local_258 = (undefined2)extraout_XMM0_Qa;
  uStack_256 = (undefined2)((ulong)extraout_XMM0_Qa >> 0x10);
  uStack_254 = (undefined2)((ulong)extraout_XMM0_Qa >> 0x20);
  uStack_252 = (undefined2)((ulong)extraout_XMM0_Qa >> 0x30);
  local_268 = (undefined2)extraout_XMM0_Qa_01;
  uStack_266 = (undefined2)((ulong)extraout_XMM0_Qa_01 >> 0x10);
  uStack_264 = (undefined2)((ulong)extraout_XMM0_Qa_01 >> 0x20);
  uStack_262 = (undefined2)((ulong)extraout_XMM0_Qa_01 >> 0x30);
  uVar1 = *in_RCX;
  local_278 = (undefined2)uVar1;
  uStack_276 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_274 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_272 = (undefined2)((ulong)uVar1 >> 0x30);
  auVar7._2_2_ = local_268;
  auVar7._0_2_ = local_258;
  auVar7._4_2_ = uStack_256;
  auVar7._6_2_ = uStack_266;
  auVar7._8_2_ = uStack_254;
  auVar7._10_2_ = uStack_264;
  auVar7._12_2_ = uStack_252;
  auVar7._14_2_ = uStack_262;
  auVar12._2_2_ = local_2d8 - local_2e8;
  auVar12._0_2_ = local_278;
  auVar12._4_2_ = uStack_276;
  auVar12._6_2_ = sStack_2d6 - sStack_2e6;
  auVar12._8_2_ = uStack_274;
  auVar12._10_2_ = sStack_2d4 - sStack_2e4;
  auVar12._12_2_ = uStack_272;
  auVar12._14_2_ = sStack_2d2 - sStack_2e2;
  auVar12 = pmaddwd(auVar7,auVar12);
  uStack_1d0 = (undefined2)extraout_XMM0_Qb;
  uStack_1ce = (undefined2)((ulong)extraout_XMM0_Qb >> 0x10);
  uStack_1cc = (undefined2)((ulong)extraout_XMM0_Qb >> 0x20);
  uStack_1ca = (undefined2)((ulong)extraout_XMM0_Qb >> 0x30);
  uStack_1e0 = (undefined2)extraout_XMM0_Qb_01;
  uStack_1de = (undefined2)((ulong)extraout_XMM0_Qb_01 >> 0x10);
  uStack_1dc = (undefined2)((ulong)extraout_XMM0_Qb_01 >> 0x20);
  uStack_1da = (undefined2)((ulong)extraout_XMM0_Qb_01 >> 0x30);
  uVar1 = in_RCX[1];
  uStack_1f0 = (undefined2)uVar1;
  uStack_1ee = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_1ec = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_1ea = (undefined2)((ulong)uVar1 >> 0x30);
  auVar6._2_2_ = uStack_1e0;
  auVar6._0_2_ = uStack_1d0;
  auVar6._4_2_ = uStack_1ce;
  auVar6._6_2_ = uStack_1de;
  auVar6._8_2_ = uStack_1cc;
  auVar6._10_2_ = uStack_1dc;
  auVar6._12_2_ = uStack_1ca;
  auVar6._14_2_ = uStack_1da;
  auVar13._2_2_ = sStack_2d0 - sStack_2e0;
  auVar13._0_2_ = uStack_1f0;
  auVar13._4_2_ = uStack_1ee;
  auVar13._6_2_ = sStack_2ce - sStack_2de;
  auVar13._8_2_ = uStack_1ec;
  auVar13._10_2_ = sStack_2cc - sStack_2dc;
  auVar13._12_2_ = uStack_1ea;
  auVar13._14_2_ = sStack_2ca - sStack_2da;
  auVar13 = pmaddwd(auVar6,auVar13);
  local_298 = (undefined2)extraout_XMM0_Qa_00;
  uStack_296 = (undefined2)((ulong)extraout_XMM0_Qa_00 >> 0x10);
  uStack_294 = (undefined2)((ulong)extraout_XMM0_Qa_00 >> 0x20);
  uStack_292 = (undefined2)((ulong)extraout_XMM0_Qa_00 >> 0x30);
  local_2a8 = (undefined2)extraout_XMM0_Qa_02;
  uStack_2a6 = (undefined2)((ulong)extraout_XMM0_Qa_02 >> 0x10);
  uStack_2a4 = (undefined2)((ulong)extraout_XMM0_Qa_02 >> 0x20);
  uStack_2a2 = (undefined2)((ulong)extraout_XMM0_Qa_02 >> 0x30);
  uVar1 = *in_R8;
  local_2b8 = (undefined2)uVar1;
  uStack_2b6 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_2b4 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_2b2 = (undefined2)((ulong)uVar1 >> 0x30);
  auVar5._2_2_ = local_2a8;
  auVar5._0_2_ = local_298;
  auVar5._4_2_ = uStack_296;
  auVar5._6_2_ = uStack_2a6;
  auVar5._8_2_ = uStack_294;
  auVar5._10_2_ = uStack_2a4;
  auVar5._12_2_ = uStack_292;
  auVar5._14_2_ = uStack_2a2;
  auVar14._2_2_ = local_2f8 - local_308;
  auVar14._0_2_ = local_2b8;
  auVar14._4_2_ = uStack_2b6;
  auVar14._6_2_ = sStack_2f6 - sStack_306;
  auVar14._8_2_ = uStack_2b4;
  auVar14._10_2_ = sStack_2f4 - sStack_304;
  auVar14._12_2_ = uStack_2b2;
  auVar14._14_2_ = sStack_2f2 - sStack_302;
  auVar14 = pmaddwd(auVar5,auVar14);
  uStack_210 = (undefined2)extraout_XMM0_Qb_00;
  uStack_20e = (undefined2)((ulong)extraout_XMM0_Qb_00 >> 0x10);
  uStack_20c = (undefined2)((ulong)extraout_XMM0_Qb_00 >> 0x20);
  uStack_20a = (undefined2)((ulong)extraout_XMM0_Qb_00 >> 0x30);
  uStack_220 = (undefined2)extraout_XMM0_Qb_02;
  uStack_21e = (undefined2)((ulong)extraout_XMM0_Qb_02 >> 0x10);
  uStack_21c = (undefined2)((ulong)extraout_XMM0_Qb_02 >> 0x20);
  uStack_21a = (undefined2)((ulong)extraout_XMM0_Qb_02 >> 0x30);
  uVar1 = in_R8[1];
  uStack_230 = (undefined2)uVar1;
  uStack_22e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_22c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_22a = (undefined2)((ulong)uVar1 >> 0x30);
  auVar16._2_2_ = uStack_220;
  auVar16._0_2_ = uStack_210;
  auVar16._4_2_ = uStack_20e;
  auVar16._6_2_ = uStack_21e;
  auVar16._8_2_ = uStack_20c;
  auVar16._10_2_ = uStack_21c;
  auVar16._12_2_ = uStack_20a;
  auVar16._14_2_ = uStack_21a;
  auVar15._2_2_ = sStack_2f0 - sStack_300;
  auVar15._0_2_ = uStack_230;
  auVar15._4_2_ = uStack_22e;
  auVar15._6_2_ = sStack_2ee - sStack_2fe;
  auVar15._8_2_ = uStack_22c;
  auVar15._10_2_ = sStack_2ec - sStack_2fc;
  auVar15._12_2_ = uStack_22a;
  auVar15._14_2_ = sStack_2ea - sStack_2fa;
  auVar15 = pmaddwd(auVar16,auVar15);
  local_98 = auVar12._0_4_;
  iStack_94 = auVar12._4_4_;
  iStack_90 = auVar12._8_4_;
  iStack_8c = auVar12._12_4_;
  local_a8 = (int)*in_R9;
  iStack_a4 = (int)((ulong)*in_R9 >> 0x20);
  iStack_a0 = (int)in_R9[1];
  iStack_9c = (int)((ulong)in_R9[1] >> 0x20);
  auVar16 = ZEXT416((uint)res1[0]);
  local_3e8 = CONCAT44(iStack_94 - iStack_a4 >> auVar16,local_98 - local_a8 >> auVar16);
  uStack_3e0._0_4_ = iStack_90 - iStack_a0 >> auVar16;
  uStack_3e0._4_4_ = iStack_8c - iStack_9c >> auVar16;
  local_b8 = auVar13._0_4_;
  iStack_b4 = auVar13._4_4_;
  iStack_b0 = auVar13._8_4_;
  iStack_ac = auVar13._12_4_;
  local_c8 = (int)*in_R9;
  iStack_c4 = (int)((ulong)*in_R9 >> 0x20);
  iStack_c0 = (int)in_R9[1];
  iStack_bc = (int)((ulong)in_R9[1] >> 0x20);
  auVar16 = ZEXT416((uint)res1[0]);
  local_3f8 = CONCAT44(iStack_b4 - iStack_c4 >> auVar16,local_b8 - local_c8 >> auVar16);
  uStack_3f0._0_4_ = iStack_b0 - iStack_c0 >> auVar16;
  uStack_3f0._4_4_ = iStack_ac - iStack_bc >> auVar16;
  local_d8 = auVar14._0_4_;
  iStack_d4 = auVar14._4_4_;
  iStack_d0 = auVar14._8_4_;
  iStack_cc = auVar14._12_4_;
  local_e8 = (int)*in_R9;
  iStack_e4 = (int)((ulong)*in_R9 >> 0x20);
  iStack_e0 = (int)in_R9[1];
  iStack_dc = (int)((ulong)in_R9[1] >> 0x20);
  auVar16 = ZEXT416((uint)res1[0]);
  local_408 = CONCAT44(iStack_d4 - iStack_e4 >> auVar16,local_d8 - local_e8 >> auVar16);
  uStack_400._0_4_ = iStack_d0 - iStack_e0 >> auVar16;
  uStack_400._4_4_ = iStack_cc - iStack_dc >> auVar16;
  local_f8 = auVar15._0_4_;
  iStack_f4 = auVar15._4_4_;
  iStack_f0 = auVar15._8_4_;
  iStack_ec = auVar15._12_4_;
  local_108 = (int)*in_R9;
  iStack_104 = (int)((ulong)*in_R9 >> 0x20);
  iStack_100 = (int)in_R9[1];
  iStack_fc = (int)((ulong)in_R9[1] >> 0x20);
  auVar15 = ZEXT416((uint)res1[0]);
  local_418 = CONCAT44(iStack_f4 - iStack_104 >> auVar15,local_f8 - local_108 >> auVar15);
  uStack_410._0_4_ = iStack_f0 - iStack_100 >> auVar15;
  uStack_410._4_4_ = iStack_ec - iStack_fc >> auVar15;
  auVar11._8_8_ = uStack_3e0;
  auVar11._0_8_ = local_3e8;
  auVar10._8_8_ = uStack_3f0;
  auVar10._0_8_ = local_3f8;
  auVar15 = packssdw(auVar11,auVar10);
  auVar9._8_8_ = uStack_400;
  auVar9._0_8_ = local_408;
  auVar8._8_8_ = uStack_410;
  auVar8._0_8_ = local_418;
  auVar16 = packssdw(auVar9,auVar8);
  local_338 = auVar15._0_2_;
  sStack_336 = auVar15._2_2_;
  sStack_334 = auVar15._4_2_;
  sStack_332 = auVar15._6_2_;
  sStack_330 = auVar15._8_2_;
  sStack_32e = auVar15._10_2_;
  sStack_32c = auVar15._12_2_;
  sStack_32a = auVar15._14_2_;
  local_348 = auVar16._0_2_;
  sStack_346 = auVar16._2_2_;
  sStack_344 = auVar16._4_2_;
  sStack_342 = auVar16._6_2_;
  sStack_340 = auVar16._8_2_;
  sStack_33e = auVar16._10_2_;
  sStack_33c = auVar16._12_2_;
  sStack_33a = auVar16._14_2_;
  *in_RDI = CONCAT17((0 < sStack_32a) * (sStack_32a < 0x100) * auVar15[0xe] - (0xff < sStack_32a),
                     CONCAT16((0 < sStack_32c) * (sStack_32c < 0x100) * auVar15[0xc] -
                              (0xff < sStack_32c),
                              CONCAT15((0 < sStack_32e) * (sStack_32e < 0x100) * auVar15[10] -
                                       (0xff < sStack_32e),
                                       CONCAT14((0 < sStack_330) * (sStack_330 < 0x100) * auVar15[8]
                                                - (0xff < sStack_330),
                                                CONCAT13((0 < sStack_332) * (sStack_332 < 0x100) *
                                                         auVar15[6] - (0xff < sStack_332),
                                                         CONCAT12((0 < sStack_334) *
                                                                  (sStack_334 < 0x100) * auVar15[4]
                                                                  - (0xff < sStack_334),
                                                                  CONCAT11((0 < sStack_336) *
                                                                           (sStack_336 < 0x100) *
                                                                           auVar15[2] -
                                                                           (0xff < sStack_336),
                                                                           (0 < local_338) *
                                                                           (local_338 < 0x100) *
                                                                           auVar15[0] -
                                                                           (0xff < local_338))))))))
  ;
  in_RDI[1] = CONCAT17((0 < sStack_33a) * (sStack_33a < 0x100) * auVar16[0xe] - (0xff < sStack_33a),
                       CONCAT16((0 < sStack_33c) * (sStack_33c < 0x100) * auVar16[0xc] -
                                (0xff < sStack_33c),
                                CONCAT15((0 < sStack_33e) * (sStack_33e < 0x100) * auVar16[10] -
                                         (0xff < sStack_33e),
                                         CONCAT14((0 < sStack_340) * (sStack_340 < 0x100) *
                                                  auVar16[8] - (0xff < sStack_340),
                                                  CONCAT13((0 < sStack_342) * (sStack_342 < 0x100) *
                                                           auVar16[6] - (0xff < sStack_342),
                                                           CONCAT12((0 < sStack_344) *
                                                                    (sStack_344 < 0x100) *
                                                                    auVar16[4] - (0xff < sStack_344)
                                                                    ,CONCAT11((0 < sStack_346) *
                                                                              (sStack_346 < 0x100) *
                                                                              auVar16[2] -
                                                                              (0xff < sStack_346),
                                                                              (0 < local_348) *
                                                                              (local_348 < 0x100) *
                                                                              auVar16[0] -
                                                                              (0xff < local_348)))))
                                        )));
  return;
}

Assistant:

static inline void blend_a64_d16_mask_w16_sse41(
    uint8_t *dst, const CONV_BUF_TYPE *src0, const CONV_BUF_TYPE *src1,
    const __m128i *m0, const __m128i *m1, const __m128i *v_round_offset,
    const __m128i *v_maxval, int shift) {
  const __m128i max_minus_m0 = _mm_sub_epi16(*v_maxval, *m0);
  const __m128i max_minus_m1 = _mm_sub_epi16(*v_maxval, *m1);
  const __m128i s0_0 = xx_loadu_128(src0);
  const __m128i s0_1 = xx_loadu_128(src0 + 8);
  const __m128i s1_0 = xx_loadu_128(src1);
  const __m128i s1_1 = xx_loadu_128(src1 + 8);
  __m128i res0_lo = _mm_madd_epi16(_mm_unpacklo_epi16(s0_0, s1_0),
                                   _mm_unpacklo_epi16(*m0, max_minus_m0));
  __m128i res0_hi = _mm_madd_epi16(_mm_unpackhi_epi16(s0_0, s1_0),
                                   _mm_unpackhi_epi16(*m0, max_minus_m0));
  __m128i res1_lo = _mm_madd_epi16(_mm_unpacklo_epi16(s0_1, s1_1),
                                   _mm_unpacklo_epi16(*m1, max_minus_m1));
  __m128i res1_hi = _mm_madd_epi16(_mm_unpackhi_epi16(s0_1, s1_1),
                                   _mm_unpackhi_epi16(*m1, max_minus_m1));
  res0_lo = _mm_srai_epi32(_mm_sub_epi32(res0_lo, *v_round_offset), shift);
  res0_hi = _mm_srai_epi32(_mm_sub_epi32(res0_hi, *v_round_offset), shift);
  res1_lo = _mm_srai_epi32(_mm_sub_epi32(res1_lo, *v_round_offset), shift);
  res1_hi = _mm_srai_epi32(_mm_sub_epi32(res1_hi, *v_round_offset), shift);
  const __m128i res0 = _mm_packs_epi32(res0_lo, res0_hi);
  const __m128i res1 = _mm_packs_epi32(res1_lo, res1_hi);
  const __m128i res = _mm_packus_epi16(res0, res1);

  _mm_storeu_si128((__m128i *)(dst), res);
}